

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O2

bool DiffDistTest2<unsigned_long,unsigned_int>(pfHash hash,bool drawDiagram)

{
  bool bVar1;
  int i;
  long lVar2;
  int keybit;
  uint bit;
  bool local_6d;
  uint h1;
  uint local_68;
  uint h2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> hashes;
  unsigned_long k;
  Rand r;
  
  Rand::reseed(&r,0xd151e);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&hashes,0x200000,(allocator_type *)&h1);
  local_6d = true;
  local_68 = (uint)drawDiagram;
  for (bit = 0; bit != 0x40; bit = bit + 1) {
    printf("Testing bit %d\n",(ulong)bit);
    for (lVar2 = 0; lVar2 != 0x200000; lVar2 = lVar2 + 1) {
      Rand::rand_p(&r,&k,8);
      (*hash)(&k,8,0,&h1);
      flipbit(&k,8,bit);
      (*hash)(&k,8,0,&h2);
      hashes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar2] = h2 ^ h1;
    }
    bVar1 = TestHashList<unsigned_int>(&hashes,true,true,SUB41(local_68,0),true,true);
    local_6d = (bool)(local_6d & bVar1);
    putchar(10);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&hashes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return local_6d;
}

Assistant:

bool DiffDistTest2 ( pfHash hash, bool drawDiagram )
{
  Rand r(857374);

  int keybits = sizeof(keytype) * 8;
  const int keycount = 256*256*32;
  keytype k;
  
  std::vector<hashtype> hashes(keycount);
  hashtype h1,h2;

  bool result = true;

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    printf("Testing bit %d\n",keybit);

    for(int i = 0; i < keycount; i++)
    {
      r.rand_p(&k,sizeof(keytype));
      
      hash(&k,sizeof(keytype),0,&h1);
      flipbit(&k,sizeof(keytype),keybit);
      hash(&k,sizeof(keytype),0,&h2);

      hashes[i] = h1 ^ h2;
    }

    result &= TestHashList<hashtype>(hashes,true,true,drawDiagram);
    printf("\n");
  }

  return result;
}